

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::RecurseOverAgents
          (BayesianGameCollaborativeGraphical *this,Index currentAgent,
          vector<bool,_std::allocator<bool>_> *agentVisited)

{
  Index i;
  vector<bool,_std::allocator<bool>_> *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pvVar3;
  uint uVar4;
  ulong uVar5;
  reference rVar6;
  Scope neighbors;
  Scope lrfScope;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<bool,_std::allocator<bool>_> *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_50 = agentVisited;
  rVar6 = std::vector<bool,_std::allocator<bool>_>::at(agentVisited,(ulong)currentAgent);
  *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
  uVar5 = 0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar2 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[0x15])();
    this_00 = local_50;
    if (CONCAT44(extraout_var,iVar2) == uVar5) break;
    (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&local_48,this,uVar5);
    bVar1 = Scope::Contains((Scope *)&local_48,currentAgent);
    if (bVar1) {
      for (uVar4 = 0;
          (long)local_48._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2 != (ulong)uVar4;
          uVar4 = uVar4 + 1) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                            (ulong)uVar4);
        i = *pvVar3;
        if (i != currentAgent) {
          bVar1 = Scope::Contains((Scope *)&local_68,i);
          if (!bVar1) {
            Scope::Insert((Scope *)&local_68,i);
          }
        }
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  for (uVar4 = 0; uVar5 = (ulong)uVar4,
      (long)local_68._M_impl.super__Vector_impl_data._M_finish -
      (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2 != uVar5; uVar4 = uVar4 + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,uVar5);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::at(this_00,(ulong)*pvVar3);
    if ((*rVar6._M_p & rVar6._M_mask) == 0) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,uVar5);
      RecurseOverAgents(this,*pvVar3,this_00);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::RecurseOverAgents(Index currentAgent,
                                                 vector<bool> &agentVisited) const
{
    agentVisited.at(currentAgent)=true;
    Scope neighbors;
    for(Index e=0;e!=GetNrLRFs();++e)
    {
        Scope lrfScope=GetScope(e);
        if(lrfScope.Contains(currentAgent))
        {
            for(Index i=0;i!=lrfScope.size();++i)
            {
                Index ag=lrfScope.at(i);
                if(ag!=currentAgent &&
                   !neighbors.Contains(ag))
                    neighbors.Insert(ag);
            }
        }
    }
    for(Index i=0;i!=neighbors.size();++i)
        if(!agentVisited.at(neighbors.at(i)))
            RecurseOverAgents(neighbors.at(i),agentVisited);
}